

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesFrequencyOcSetMode(zes_freq_handle_t hFrequency,zes_oc_mode_t CurrentOcMode)

{
  zes_pfnFrequencyOcSetMode_t pfnOcSetMode;
  dditable_t *dditable;
  ze_result_t result;
  zes_oc_mode_t CurrentOcMode_local;
  zes_freq_handle_t hFrequency_local;
  
  if (*(code **)(*(long *)(hFrequency + 8) + 0xb30) == (code *)0x0) {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFrequency_local._4_4_ =
         (**(code **)(*(long *)(hFrequency + 8) + 0xb30))(*(undefined8 *)hFrequency,CurrentOcMode);
  }
  return hFrequency_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcSetMode(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_oc_mode_t CurrentOcMode                     ///< [in] Current Overclocking Mode ::zes_oc_mode_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_freq_object_t*>( hFrequency )->dditable;
        auto pfnOcSetMode = dditable->zes.Frequency.pfnOcSetMode;
        if( nullptr == pfnOcSetMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFrequency = reinterpret_cast<zes_freq_object_t*>( hFrequency )->handle;

        // forward to device-driver
        result = pfnOcSetMode( hFrequency, CurrentOcMode );

        return result;
    }